

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  test_impl *this;
  ostream *poVar1;
  consumer *this_00;
  string local_90;
  string local_70;
  shared_ptr<service> local_40;
  undefined1 local_30 [8];
  consumer test_consumer;
  injected<consumer> i_consumer;
  
  inject::context<0>::injected<consumer>::injected((injected<consumer> *)&test_consumer._service.pn)
  ;
  this = (test_impl *)operator_new(8);
  (this->super_service)._vptr_service = (_func_int **)0x0;
  test_impl::test_impl(this);
  boost::shared_ptr<service>::shared_ptr<test_impl>(&local_40,this);
  consumer::consumer((consumer *)local_30,&local_40);
  boost::shared_ptr<service>::~shared_ptr(&local_40);
  poVar1 = std::operator<<((ostream *)&std::cout,"with injected struct service name is \'");
  this_00 = inject::context<0>::injected<consumer>::operator->
                      ((injected<consumer> *)&test_consumer._service.pn);
  consumer::service_name_abi_cxx11_(&local_70,this_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  poVar1 = std::operator<<(poVar1,"\'");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_70);
  poVar1 = std::operator<<((ostream *)&std::cout,"with test struct service name is \'");
  consumer::service_name_abi_cxx11_(&local_90,(consumer *)local_30);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  poVar1 = std::operator<<(poVar1,"\'");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_90);
  consumer::~consumer((consumer *)local_30);
  inject::context<0>::injected<consumer>::~injected
            ((injected<consumer> *)&test_consumer._service.pn);
  return 0;
}

Assistant:

int main() {

    // request an instance with injected service
    context<>::injected<consumer> i_consumer;

    // manually create an instance with test service
    consumer test_consumer(
        consumer::service_ptr(new test_impl()));

    cout << "with injected struct service name is '" <<
        i_consumer->service_name() << "'" << endl;
    
    cout << "with test struct service name is '" <<
        test_consumer.service_name() << "'" << endl;

    return 0;
}